

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

char * __thiscall
fmt::v11::detail::do_format_decimal<char,unsigned__int128>
          (detail *this,char *out,unsigned___int128 value,int size)

{
  ulong uVar1;
  undefined8 in_RAX;
  ulong in_RCX;
  undefined4 in_register_00000014;
  ulong uVar2;
  uint uVar3;
  undefined8 unaff_RBX;
  ulong uVar4;
  ulong uVar5;
  char *pcVar6;
  bool bVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  
  uVar2 = CONCAT44(in_register_00000014,size);
  uVar4 = in_RCX & 0xffffffff;
  uVar3 = (uint)in_RCX;
  auVar9._8_8_ = unaff_RBX;
  auVar9._0_8_ = in_RAX;
  count_digits_fallback<unsigned__int128>((detail *)out,(unsigned___int128)auVar9);
  pcVar6 = out;
  uVar5 = uVar2;
  if ((out < (char *)0x64) <= uVar2) {
    do {
      uVar3 = (int)uVar4 - 2;
      uVar4 = (ulong)uVar3;
      auVar9 = __udivti3(pcVar6,uVar5,100,0);
      uVar2 = auVar9._8_8_;
      out = auVar9._0_8_;
      *(undefined2 *)(this + uVar4) =
           *(undefined2 *)(digits2(unsigned_long)::data + (long)(pcVar6 + (long)out * -100) * 2);
      bVar7 = (char *)0x270f < pcVar6;
      bVar8 = uVar5 != 0;
      uVar1 = -uVar5;
      pcVar6 = out;
      uVar5 = uVar2;
    } while (bVar8 || uVar1 < bVar7);
  }
  if (uVar2 < (out < (char *)0xa)) {
    uVar5 = (ulong)(uVar3 - 1);
    this[uVar5] = (detail)((byte)out | 0x30);
  }
  else {
    uVar5 = (ulong)(uVar3 - 2);
    *(undefined2 *)(this + uVar5) = *(undefined2 *)(digits2(unsigned_long)::data + (long)out * 2);
  }
  return (char *)(this + uVar5);
}

Assistant:

FMT_CONSTEXPR20 auto do_format_decimal(Char* out, UInt value, int size)
    -> Char* {
  FMT_ASSERT(size >= count_digits(value), "invalid digit count");
  unsigned n = to_unsigned(size);
  while (value >= 100) {
    // Integer division is slow so do it for a group of two digits instead
    // of for every digit. The idea comes from the talk by Alexandrescu
    // "Three Optimization Tips for C++". See speed-test for a comparison.
    n -= 2;
    write2digits(out + n, static_cast<unsigned>(value % 100));
    value /= 100;
  }
  if (value >= 10) {
    n -= 2;
    write2digits(out + n, static_cast<unsigned>(value));
  } else {
    out[--n] = static_cast<Char>('0' + value);
  }
  return out + n;
}